

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * soul::makeSafeIdentifierName(string *__return_storage_ptr__,string *s)

{
  char c;
  pointer pcVar1;
  bool bVar2;
  _Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *p_Var3;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  size_type sVar5;
  _Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *p_Var6;
  _Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *p_Var7;
  _Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *p_Var8;
  string *__range1;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar9 = s->_M_string_length;
  __it._M_current = (char *)s;
  for (sVar5 = 0; sVar9 != sVar5; sVar5 = sVar5 + 1) {
    c = pcVar1[sVar5];
    __it._M_current = (char *)(ulong)(uint)(int)c;
    bVar2 = containsChar(" ,./;",c);
    if (bVar2) {
      pcVar1[sVar5] = '_';
    }
  }
  p_Var3 = (_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *)
           (s->_M_dataplus)._M_p;
  sVar9 = s->_M_string_length;
  p_Var8 = p_Var3 + sVar9;
  p_Var6 = p_Var3;
  sVar5 = sVar9;
  for (lVar4 = (long)sVar9 >> 2; p_Var7 = p_Var6, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6,__it);
    if (bVar2) goto LAB_002016c9;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6 + 1,__it);
    p_Var7 = p_Var6 + 1;
    if (bVar2) goto LAB_002016c9;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6 + 2,__it);
    p_Var7 = p_Var6 + 2;
    if (bVar2) goto LAB_002016c9;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6 + 3,__it);
    p_Var7 = p_Var6 + 3;
    if (bVar2) goto LAB_002016c9;
    p_Var6 = p_Var6 + 4;
    sVar5 = sVar5 - 4;
  }
  if (sVar5 == 1) {
LAB_002016af:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6,__it);
    p_Var7 = p_Var6;
    if (!bVar2) {
      p_Var7 = p_Var8;
    }
  }
  else if (sVar5 == 2) {
LAB_002016a0:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6,__it);
    p_Var7 = p_Var6;
    if (!bVar2) {
      p_Var6 = p_Var6 + 1;
      goto LAB_002016af;
    }
  }
  else {
    if (sVar5 != 3) goto LAB_0020170e;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>::
            operator()(p_Var6,__it);
    if (!bVar2) {
      p_Var6 = p_Var6 + 1;
      goto LAB_002016a0;
    }
  }
LAB_002016c9:
  p_Var6 = p_Var7;
  if (p_Var7 != p_Var8) {
    while (p_Var6 = p_Var6 + 1, p_Var6 != p_Var8) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::$_0>
              ::operator()(p_Var6,__it);
      if (!bVar2) {
        *p_Var7 = *p_Var6;
        p_Var7 = p_Var7 + 1;
      }
    }
    p_Var3 = (_Iter_pred<soul::makeSafeIdentifierName(std::__cxx11::string)::__0> *)
             (s->_M_dataplus)._M_p;
    sVar9 = s->_M_string_length;
    p_Var8 = p_Var7;
  }
LAB_0020170e:
  std::__cxx11::string::erase(s,p_Var8,p_Var3 + sVar9);
  if ((byte)(*(s->_M_dataplus)._M_p - 0x30U) < 10) {
    std::operator+(&local_50,"_",s);
    std::__cxx11::string::operator=((string *)s,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string makeSafeIdentifierName (std::string s)
{
    for (auto& c : s)
        if (containsChar (" ,./;", c))
            c = '_';

    s.erase (std::remove_if (s.begin(), s.end(), [&] (char c) { return ! isSafeIdentifierChar (c); }), s.end());

    // Identifiers can't start with a digit
    if (isDigit (s[0]))
        s = "_" + s;

    return s;
}